

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::Arg(BenchmarkImp *this,int x)

{
  bool bVar1;
  int iVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  char *in_RDI;
  value_type *in_stack_ffffffffffffff78;
  BenchmarkImp *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *this_01;
  initializer_list<int> in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> local_18;
  
  iVar2 = ArgsCnt(in_stack_ffffffffffffff80);
  bVar1 = false;
  if (iVar2 != -1) {
    iVar2 = ArgsCnt(in_stack_ffffffffffffff80);
    if (iVar2 != 1) {
      in_stack_ffffffffffffff90 = &local_18;
      CheckHandler::CheckHandler
                ((CheckHandler *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_RDI,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      bVar1 = true;
      CheckHandler::GetLog((CheckHandler *)in_stack_ffffffffffffff90);
      goto LAB_00165712;
    }
  }
  GetNullLogInstance();
LAB_00165712:
  if (!bVar1) {
    this_00 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(in_RDI + 0x28);
    __a = (allocator_type *)&stack0xffffffffffffffa4;
    this_01 = (vector<int,_std::allocator<int>_> *)0x1;
    std::allocator<int>::allocator((allocator<int> *)0x16577b);
    std::vector<int,_std::allocator<int>_>::vector(this_01,in_stack_ffffffffffffffb8,__a);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(this_00,in_stack_ffffffffffffff78);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff90);
    std::allocator<int>::~allocator((allocator<int> *)0x1657bb);
    return;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_00165725);
}

Assistant:

void BenchmarkImp::Arg(int x) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  args_.push_back({x});
}